

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_flow.cc
# Opt level: O1

void __thiscall FlowDecl::GenNewDataUnit(FlowDecl *this,Output *out_cc)

{
  ParameterizedType *pPVar1;
  int iVar2;
  char *pcVar3;
  
  pPVar1 = this->dataunit_->data_type_;
  AnalyzerDataUnit::GenNewDataUnit
            (this->dataunit_,out_cc,(this->super_AnalyzerDecl).super_TypeDecl.env_);
  if ((pPVar1->super_Type).buffer_input_ == true) {
    iVar2 = (*(pPVar1->super_Type).super_DataDepElement._vptr_DataDepElement[0x16])(pPVar1);
    if (iVar2 == 2) {
      pcVar3 = Env::LValue((this->super_AnalyzerDecl).super_TypeDecl.env_,flow_buffer_id);
      Output::println(out_cc,"%s->NewFrame(0, false);",pcVar3);
    }
  }
  AnalyzerDataUnit::GenNewContext
            (this->dataunit_,out_cc,(this->super_AnalyzerDecl).super_TypeDecl.env_);
  return;
}

Assistant:

void FlowDecl::GenNewDataUnit(Output* out_cc)
	{
	Type* unit_datatype = dataunit_->data_type();
	// dataunit_->data_type()->GenPreParsing(out_cc, env_);
	dataunit_->GenNewDataUnit(out_cc, env_);
	if ( unit_datatype->buffer_input() && unit_datatype->buffer_mode() == Type::BUFFER_BY_LENGTH )
		{
		out_cc->println("%s->NewFrame(0, false);", env_->LValue(flow_buffer_id));
		}
	dataunit_->GenNewContext(out_cc, env_);
	}